

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::clean(CaptureVertexInterleaved *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_program != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program = 0;
  }
  if (this->m_framebuffer != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_framebuffer);
    this->m_framebuffer = 0;
  }
  if (this->m_renderbuffer != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_renderbuffer);
    this->m_renderbuffer = 0;
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])(this);
  if (this->m_vertex_array_object != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object);
    this->m_vertex_array_object = 0;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::clean(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_program)
	{
		gl.deleteProgram(m_program);

		m_program = 0;
	}

	if (m_framebuffer)
	{
		gl.deleteFramebuffers(1, &m_framebuffer);

		m_framebuffer = 0;
	}

	if (m_renderbuffer)
	{
		gl.deleteFramebuffers(1, &m_renderbuffer);

		m_renderbuffer = 0;
	}

	cleanBuffer();

	if (m_vertex_array_object)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object);

		m_vertex_array_object = 0;
	}
}